

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getSubwordVector(FastText *this,Vector *vec,string *subword)

{
  uint32_t ind;
  int32_t iVar1;
  element_type *peVar2;
  element_type *this_00;
  uint uVar3;
  string *in_RDX;
  Dictionary *in_RSI;
  Vector *in_RDI;
  int32_t h;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  Vector::zero((Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a9915);
  ind = Dictionary::hash(in_RSI,in_RDX);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a9930);
  uVar3 = ind % (uint)peVar2->bucket;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a9959);
  iVar1 = Dictionary::nwords(this_00);
  addInputVector((FastText *)CONCAT44(uVar3 + iVar1,uVar3),in_RDI,ind);
  return;
}

Assistant:

void FastText::getSubwordVector(Vector& vec, const std::string& subword) const {
  vec.zero();
  int32_t h = dict_->hash(subword) % args_->bucket;
  h = h + dict_->nwords();
  addInputVector(vec, h);
}